

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPReader.cpp
# Opt level: O0

int __thiscall BMPReader::open(BMPReader *this,char *__file,int __oflag,...)

{
  undefined1 auVar1 [16];
  uint uVar2;
  char *__filename;
  FILE *__stream;
  undefined8 uVar3;
  size_t sVar4;
  ulong uVar5;
  RGB *pRVar6;
  RGB *extraout_RAX;
  RGB *local_98;
  uint local_88;
  uint i;
  undefined1 local_70 [4];
  uint local_6c;
  BitMapInfoHeader bitMapInfoHeader;
  BitMapCoreHeader bitMapCoreHeader;
  uint infoHeaderSize;
  BitMapFileHeader fileHeader;
  FILE *file;
  string *path_local;
  BMPReader *this_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"rb");
  if (__stream == (FILE *)0x0) {
    uVar3 = std::__cxx11::string::c_str();
    uVar2 = printf("error occured when opening file:%s",uVar3);
    pRVar6 = (RGB *)(ulong)uVar2;
    this_local._7_1_ = 0;
  }
  else {
    BitMapFileHeader::BitMapFileHeader(&bitMapCoreHeader.bcBitCount);
    sVar4 = fread(&bitMapCoreHeader.bcBitCount,0xe,1,__stream);
    if (sVar4 == 1) {
      if (bitMapCoreHeader.bcBitCount == 0x4d42) {
        fread(&bitMapCoreHeader.bcWidth,4,1,__stream);
        fseek(__stream,-4,1);
        if (bitMapCoreHeader._4_4_ == 0xc) {
          BitMapCoreHeader::BitMapCoreHeader(&bitMapInfoHeader.biClrUsed);
          sVar4 = fread(&bitMapInfoHeader.biClrUsed,0xc,1,__stream);
          if (sVar4 != 1) {
            uVar2 = printf("Error - mal-structure BITMAPINFOHEADER");
            pRVar6 = (RGB *)(ulong)uVar2;
            this_local._7_1_ = 0;
            goto LAB_00104416;
          }
          this->width = (uint)(ushort)bitMapInfoHeader.biClrImportant;
          this->height = (uint)bitMapInfoHeader.biClrImportant._2_2_;
          if (bitMapCoreHeader.bcSize._2_2_ != 0x18) {
            uVar2 = printf("Error - the picture format is not consistent with our programm");
            pRVar6 = (RGB *)(ulong)uVar2;
            this_local._7_1_ = 0;
            goto LAB_00104416;
          }
        }
        else {
          sVar4 = fread(local_70,0x28,1,__stream);
          if (sVar4 != 1) {
            uVar2 = printf("Error - mal-structure BITMAPINFOHEADER");
            pRVar6 = (RGB *)(ulong)uVar2;
            this_local._7_1_ = 0;
            goto LAB_00104416;
          }
          this->width = local_6c;
          this->height = bitMapInfoHeader.biSize;
          if (bitMapInfoHeader.biWidth._2_2_ != 0x18) {
            uVar2 = printf("Error - the picture format is not consistent with our programm");
            pRVar6 = (RGB *)(ulong)uVar2;
            this_local._7_1_ = 0;
            goto LAB_00104416;
          }
        }
        this->paddingBytes = this->width & 3;
        auVar1 = ZEXT416(this->width * this->height) * ZEXT816(3);
        uVar5 = auVar1._0_8_;
        if (auVar1._8_8_ != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        pRVar6 = (RGB *)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
        local_98 = (RGB *)0x0;
        if (pRVar6 != (RGB *)0x0) {
          local_98 = pRVar6;
        }
        this->data = local_98;
        if (this->data == (RGB *)0x0) {
          uVar2 = printf("Error - error when allocating memroy for RGB");
          pRVar6 = (RGB *)(ulong)uVar2;
          this_local._7_1_ = 0;
        }
        else {
          fseek(__stream,(ulong)fileHeader.bfSize,0);
          for (local_88 = 0; local_88 < this->height; local_88 = local_88 + 1) {
            uVar2 = this->width;
            sVar4 = fread(this->data + ((this->height - 1) - local_88) * this->width,3,
                          (ulong)this->width,__stream);
            if (uVar2 != sVar4) {
              printf("Error - something wrong when reading data from BMP file");
              pRVar6 = this->data;
              if (pRVar6 != (RGB *)0x0) {
                operator_delete(pRVar6,3);
                pRVar6 = extraout_RAX;
              }
              this_local._7_1_ = 0;
              goto LAB_00104416;
            }
            fseek(__stream,(ulong)this->paddingBytes,1);
          }
          uVar2 = fclose(__stream);
          pRVar6 = (RGB *)(ulong)uVar2;
          this_local._7_1_ = 1;
        }
      }
      else {
        uVar2 = printf("Error - this is not a BMP file that you\'re reading");
        pRVar6 = (RGB *)(ulong)uVar2;
        this_local._7_1_ = 0;
      }
    }
    else {
      uVar2 = printf("Error - error occured when reading BITMAPFILEHEADER");
      pRVar6 = (RGB *)(ulong)uVar2;
      this_local._7_1_ = 0;
    }
  }
LAB_00104416:
  return (int)CONCAT71((int7)((ulong)pRVar6 >> 8),this_local._7_1_);
}

Assistant:

bool BMPReader::open(std::string& path) {
	FILE* file = nullptr;

	if ((file = fopen(path.c_str(), "rb")) == nullptr) {
		printf("error occured when opening file:%s", path.c_str());
		return false;
	}

	BitMapFileHeader fileHeader;

	if (fread(&fileHeader, sizeof(fileHeader), 1, file) != 1) {
		printf("Error - error occured when reading BITMAPFILEHEADER");
		return false;
	}

	if(fileHeader.bfType != 0x4D42) {
		printf("Error - this is not a BMP file that you're reading");
		return false;
	}

	uint infoHeaderSize;
	fread(&infoHeaderSize, sizeof(infoHeaderSize), 1, file);
	fseek(file, -sizeof(infoHeaderSize), SEEK_CUR);
	//2中infoHeader, 通过size来判断
	if (infoHeaderSize == sizeof(BitMapCoreHeader)) {
		BitMapCoreHeader bitMapCoreHeader;
		if (fread(&bitMapCoreHeader, sizeof(bitMapCoreHeader), 1, file) != 1) {
			printf("Error - mal-structure BITMAPINFOHEADER");
			return false;
		}
		this->width = bitMapCoreHeader.bcWidth;
		this->height = bitMapCoreHeader.bcHeight;
		if (bitMapCoreHeader.bcBitCount != 24) {
			printf("Error - the picture format is not consistent with our programm");
			return false;
		}
	} else {
		BitMapInfoHeader bitMapInfoHeader;
		if (fread(&bitMapInfoHeader, sizeof(bitMapInfoHeader), 1, file) != 1) {
			printf("Error - mal-structure BITMAPINFOHEADER");
			return false;
		}
		this->width = bitMapInfoHeader.biWidth;
		this->height = bitMapInfoHeader.biHeight;
		if (bitMapInfoHeader.biBitCount != 24) {
			printf("Error - the picture format is not consistent with our programm");
			return false;
		}
	}
	//mutiple times of 4 bytes each row,
	// if width = 1, 1 * 3个像素 * 8位 = 24位, 差一个字节, paddingSize = 1
	// if width = 2, 2 * 3个 * 8位 = 48位  paddingSize = 2
	// if width = 3, paddingSize = 3
	// if width = 4, paddingSize = 0
	this->paddingBytes = width % 4;

	data = new (std::nothrow) RGB[this->width * this->height];
	if (!data) {
		printf("Error - error when allocating memroy for RGB");
		return false;
	}
	//跳到data数据的位置
	fseek(file, fileHeader.bfOffBits, SEEK_SET);
	for (uint i = 0; i < height; i++) {
		//read data
		if (width != fread(data + (height - 1 - i) * width , sizeof(RGB), width, file)) {
			printf("Error - something wrong when reading data from BMP file");
			delete data;
			return false;
		}
		fseek(file, paddingBytes, SEEK_CUR);
	}
	fclose(file);
	return true;
}